

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::SetCommonFieldVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  FieldDescriptor FVar2;
  int iVar3;
  mapped_type *pmVar4;
  FieldDescriptor *pFVar5;
  char *pcVar6;
  char *pcVar7;
  long *plVar8;
  undefined8 *puVar9;
  Options *in_RCX;
  ulong uVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  _Alloc_hider _Var13;
  key_type local_c8;
  string local_a8;
  key_type local_78;
  Options *local_58;
  undefined1 local_50 [32];
  
  SetCommonVars(options,variables);
  Namespace_abi_cxx11_(&local_a8,(cpp *)descriptor,(FieldDescriptor *)options,in_RCX);
  paVar12 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ns","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c8);
  local_58 = options;
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
  pFVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
    pFVar5 = extraout_RDX_00;
  }
  buffer = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
    pFVar5 = extraout_RDX_01;
  }
  FieldName_abi_cxx11_(&local_a8,(cpp *)descriptor,pFVar5);
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (((byte)descriptor[1] & 8) == 0) {
    pFVar5 = descriptor + 0x20;
    uVar10 = 0x28;
  }
  else {
    pFVar5 = descriptor + 0x28;
    if (*(long *)(descriptor + 0x28) == 0) {
      pFVar5 = descriptor + 0x10;
    }
    uVar10 = (ulong)(*(long *)(descriptor + 0x28) == 0) << 5 | 0x50;
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  pcVar6 = FastInt32ToBufferLeft
                     ((int)((ulong)((long)descriptor - *(long *)(*(long *)pFVar5 + uVar10)) >> 3) *
                      0x38e38e39,buffer->_M_local_buf);
  local_a8._M_string_length = (long)pcVar6 - (long)buffer;
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"index","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  pcVar6 = FastInt32ToBufferLeft(*(int32 *)(descriptor + 4),buffer->_M_local_buf);
  local_a8._M_string_length = (long)pcVar6 - (long)buffer;
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"number","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c8);
  descriptor_00 = extraout_RDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
    descriptor_00 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
    descriptor_00 = extraout_RDX_04;
  }
  ClassName_abi_cxx11_
            (&local_a8,*(cpp **)(descriptor + (ulong)((byte)descriptor[1] & 8) + 0x20),descriptor_00
            );
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"classname","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_a8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_c8._M_dataplus._M_p = (pointer)descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)&local_a8,
               (FieldDescriptor **)&local_c8);
  }
  pcVar7 = DeclaredTypeMethodName((uint)(byte)descriptor[2]);
  local_a8._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"declared_type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a8);
  pcVar6 = (char *)pmVar4->_M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar6,(ulong)pcVar7);
  pFVar5 = extraout_RDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
    pFVar5 = extraout_RDX_06;
  }
  FieldName_abi_cxx11_(&local_c8,(cpp *)descriptor,pFVar5);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8.field_2._8_4_ = (undefined4)plVar8[3];
    local_a8.field_2._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
    local_a8._M_dataplus._M_p = (pointer)buffer;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_a8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"field_member","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  iVar3 = *(int *)(descriptor + 4);
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_78._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_50._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)&local_78,
               (FieldDescriptor **)local_50);
  }
  uVar1 = iVar3 * 8 + 1;
  iVar3 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  pcVar6 = FastUInt64ToBufferLeft
                     ((ulong)(iVar3 * 9 + 0x49U >> 6) << (descriptor[2] == (FieldDescriptor)0xa),
                      buffer->_M_local_buf);
  local_a8._M_string_length = (long)pcVar6 - (long)buffer;
  paVar12 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"tag_size","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  pcVar6 = "";
  if (*(char *)(*(long *)(descriptor + 0x38) + 0x4e) != '\0') {
    pcVar6 = "PROTOBUF_DEPRECATED ";
  }
  pcVar7 = pcVar6 + 0x14;
  if (*(char *)(*(long *)(descriptor + 0x38) + 0x4e) == '\0') {
    pcVar7 = pcVar6;
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar6,pcVar7);
  local_c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"deprecated_attr","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"set_hasbit","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"clear_hasbit","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3e25d9);
  pFVar5 = extraout_RDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
    pFVar5 = extraout_RDX_08;
  }
  FVar2 = descriptor[1];
  if (((byte)FVar2 & 2) == 0) {
    if ((((byte)FVar2 & 0x60) == 0x20) &&
       (pFVar5 = *(FieldDescriptor **)(descriptor + 0x10), pFVar5[0x3a] == (FieldDescriptor)0x2)) {
      if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(descriptor + 0x28) == 0)) goto LAB_002e4eb2;
    }
    else if (((byte)FVar2 & 0x60) == 0x40) goto LAB_002e4eb2;
LAB_002e4ec1:
    local_a8._M_dataplus._M_p = (pointer)buffer;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"set_hasbit_io","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a8);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3e25d9);
    _Var13._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == buffer) goto LAB_002e4f10;
  }
  else {
LAB_002e4eb2:
    if (*(char *)(*(long *)(descriptor + 0x38) + 0x4f) != '\0') goto LAB_002e4ec1;
    FieldName_abi_cxx11_(&local_78,(cpp *)descriptor,pFVar5);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x416415);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      local_c8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_c8.field_2._8_8_ = plVar8[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_c8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_c8._M_string_length = plVar8[1];
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    psVar11 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_a8.field_2._M_allocated_capacity = *psVar11;
      local_a8.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
      local_a8.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
      local_a8._M_dataplus._M_p = (pointer)buffer;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar11;
      local_a8._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_a8._M_string_length = puVar9[1];
    *puVar9 = psVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_50._0_8_ = (FieldDescriptor *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"set_hasbit_io","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_50);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
    if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != buffer) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    _Var13._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_002e4f10;
  }
  operator_delete(_Var13._M_p);
LAB_002e4f10:
  AddAccessorAnnotations(descriptor,local_58,variables);
  local_a8._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"{","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"}","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != buffer) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetCommonFieldVariables(const FieldDescriptor* descriptor,
                             std::map<std::string, std::string>* variables,
                             const Options& options) {
  SetCommonVars(options, variables);
  (*variables)["ns"] = Namespace(descriptor, options);
  (*variables)["name"] = FieldName(descriptor);
  (*variables)["index"] = StrCat(descriptor->index());
  (*variables)["number"] = StrCat(descriptor->number());
  (*variables)["classname"] = ClassName(FieldScope(descriptor), false);
  (*variables)["declared_type"] = DeclaredTypeMethodName(descriptor->type());
  (*variables)["field_member"] = FieldName(descriptor) + "_";

  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), descriptor->type()));
  (*variables)["deprecated_attr"] = DeprecatedAttribute(options, descriptor);

  (*variables)["set_hasbit"] = "";
  (*variables)["clear_hasbit"] = "";
  if (HasHasbit(descriptor)) {
    (*variables)["set_hasbit_io"] =
        "_Internal::set_has_" + FieldName(descriptor) + "(&_has_bits_);";
  } else {
    (*variables)["set_hasbit_io"] = "";
  }

  AddAccessorAnnotations(descriptor, options, variables);

  // These variables are placeholders to pick out the beginning and ends of
  // identifiers for annotations (when doing so with existing variables would
  // be ambiguous or impossible). They should never be set to anything but the
  // empty string.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
}